

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ES5ArrayTypeHandler.cpp
# Opt level: O0

bool __thiscall
Js::IndexPropertyDescriptorMap::TryGetLastIndex(IndexPropertyDescriptorMap *this,uint32 *lastIndex)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  uint **ppuVar4;
  undefined4 *puVar5;
  IndexPropertyDescriptor *pIStack_30;
  bool b;
  IndexPropertyDescriptor *descriptor;
  uint32 key;
  int i;
  uint32 *lastIndex_local;
  IndexPropertyDescriptorMap *this_local;
  
  _key = lastIndex;
  lastIndex_local = (uint32 *)this;
  iVar3 = Count(this);
  if (iVar3 == 0) {
    this_local._7_1_ = false;
  }
  else {
    EnsureIndexList(this);
    descriptor._4_4_ = Count(this);
    do {
      descriptor._4_4_ = descriptor._4_4_ + -1;
      if (descriptor._4_4_ < 0) {
        return false;
      }
      ppuVar4 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_int__
                          ((WriteBarrierPtr *)&this->indexList);
      descriptor._0_4_ = (*ppuVar4)[descriptor._4_4_];
      bVar2 = TryGetReference(this,(uint32)descriptor,&stack0xffffffffffffffd0);
      if ((!bVar2) || (pIStack_30 == (IndexPropertyDescriptor *)0x0)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/ES5ArrayTypeHandler.cpp"
                                    ,0x59,"(b && descriptor)","b && descriptor");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
    } while ((pIStack_30->Attributes & 8) != 0);
    *_key = (uint32)descriptor;
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool IndexPropertyDescriptorMap::TryGetLastIndex(uint32* lastIndex)
    {
        if (Count() == 0)
        {
            return false;
        }

        EnsureIndexList();

        // Search the index list backwards for the last index
        for (int i = Count() - 1; i >= 0; i--)
        {
            uint32 key = indexList[i];

            IndexPropertyDescriptor* descriptor;
            bool b = TryGetReference(key, &descriptor);
            Assert(b && descriptor);

            if (!(descriptor->Attributes & PropertyDeleted))
            {
                *lastIndex = key;
                return true;
            }
        }

        return false;
    }